

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<ProString,char[14]>
                    (QList<ProString> *vector,char (*u) [14],qsizetype from)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  undefined7 extraout_var;
  long lVar6;
  long lVar7;
  ProString *this;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    this = (vector->d).ptr + from;
    lVar5 = uVar1 * 0x10;
    lVar2 = uVar1 * 0x30 + from * -0x30;
    lVar3 = 0x30 - (long)this;
    do {
      lVar7 = lVar3;
      lVar6 = lVar2;
      if (lVar6 == 0) goto LAB_0018ad8c;
      bVar4 = ProString::operator==(this,*u);
      lVar5 = CONCAT71(extraout_var,bVar4);
      this = this + 1;
      lVar2 = lVar6 + -0x30;
      lVar3 = lVar7 + -0x30;
    } while (!bVar4);
    lVar5 = (-((long)&(vector->d).ptr[-1].m_string.d.d + lVar7) >> 4) * -0x5555555555555555;
LAB_0018ad8c:
    if (lVar6 != 0) {
      return lVar5;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}